

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int attach_get_source(ATTACH_HANDLE attach,AMQP_VALUE *source_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar3 = 0x1168;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(attach->composite_value,&item_count);
    iVar3 = 0x1170;
    if ((iVar1 == 0) && (iVar3 = 0x1176, 5 < item_count)) {
      value = amqpvalue_get_composite_item_in_place(attach->composite_value,5);
      iVar3 = 0x117e;
      if (value != (AMQP_VALUE)0x0) {
        AVar2 = amqpvalue_get_type(value);
        if (AVar2 != AMQP_TYPE_NULL) {
          *source_value = value;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int attach_get_source(ATTACH_HANDLE attach, AMQP_VALUE* source_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        if (amqpvalue_get_composite_item_count(attach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 5)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(attach_instance->composite_value, 5);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *source_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}